

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

void __thiscall
slang::syntax::ClassDeclarationSyntax::setChild
          (ClassDeclarationSyntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_00508458 + *(int *)(&DAT_00508458 + index * 4)))();
  return;
}

Assistant:

void ClassDeclarationSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: virtualOrInterface = child.token(); return;
        case 2: classKeyword = child.token(); return;
        case 3: finalSpecifier = child.node() ? &child.node()->as<ClassSpecifierSyntax>() : nullptr; return;
        case 4: name = child.token(); return;
        case 5: parameters = child.node() ? &child.node()->as<ParameterPortListSyntax>() : nullptr; return;
        case 6: extendsClause = child.node() ? &child.node()->as<ExtendsClauseSyntax>() : nullptr; return;
        case 7: implementsClause = child.node() ? &child.node()->as<ImplementsClauseSyntax>() : nullptr; return;
        case 8: semi = child.token(); return;
        case 9: items = child.node()->as<SyntaxList<MemberSyntax>>(); return;
        case 10: endClass = child.token(); return;
        case 11: endBlockName = child.node() ? &child.node()->as<NamedBlockClauseSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}